

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O1

void __thiscall NFALUT::NFALUT(NFALUT *this,int size,double _prob,double _logNT)

{
  bool bVar1;
  int *piVar2;
  ulong uVar3;
  int k;
  long lVar4;
  long lVar5;
  double dVar6;
  
  this->LUTSize = size;
  uVar3 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar3 = (long)size * 4;
  }
  piVar2 = (int *)operator_new__(uVar3);
  this->LUT = piVar2;
  this->prob = _prob;
  this->logNT = _logNT;
  *piVar2 = 1;
  uVar3 = (ulong)(uint)this->LUTSize;
  if (1 < this->LUTSize) {
    k = 1;
    lVar4 = 1;
    do {
      this->LUT[lVar4] = (int)uVar3 + 1;
      dVar6 = nfa(this,(int)lVar4,k);
      if (0.0 <= dVar6) {
LAB_0011a211:
        this->LUT[lVar4] = k;
      }
      else {
        lVar5 = (long)k;
        bVar1 = true;
        if (lVar5 < lVar4) {
          do {
            lVar5 = lVar5 + 1;
            k = k + 1;
            dVar6 = nfa(this,(int)lVar4,(int)lVar5);
            if (0.0 <= dVar6) break;
          } while (lVar5 < lVar4);
          bVar1 = dVar6 < 0.0;
        }
        if (!bVar1) goto LAB_0011a211;
      }
      lVar4 = lVar4 + 1;
      uVar3 = (ulong)this->LUTSize;
    } while (lVar4 < (long)uVar3);
  }
  return;
}

Assistant:

NFALUT::NFALUT(int size, double _prob, double _logNT)
{
	LUTSize = size;
	LUT = new int[LUTSize];

	prob = _prob;
	logNT = _logNT;

	LUT[0] = 1;
	int j = 1;
	for (int i = 1; i<LUTSize; i++) {
		LUT[i] = LUTSize + 1;
		double ret = nfa(i, j);
		if (ret < 0) {
			while (j < i) {
				j++;
				ret = nfa(i, j);
				if (ret >= 0) break;
			} //end-while

			if (ret < 0) continue;
		} //end-if

		LUT[i] = j;
	} //end-for
}